

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O2

void __thiscall SM83::add_hl_hl(SM83 *this)

{
  ushort uVar1;
  unsigned_short *unaff_RBX;
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&>
  fmt;
  
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = (char *)0x48;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&>
            ((v11 *)"AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  ADD HL, HL\n",fmt,
             &(this->field_1).bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,unaff_RBX);
  uVar1 = (this->field_3).hl;
  (this->field_0).field_1.f =
       (byte)(uVar1 >> 0xb) & 0x10 | (byte)(uVar1 >> 6) & 0x20 | (this->field_0).field_1.f & 0x8f;
  (this->field_3).hl = uVar1 * 2;
  Timer::AdvanceCycles(this->timer,4);
  return;
}

Assistant:

void SM83::add_hl_hl() {
    LTRACE("ADD HL, HL");
    u32 result = hl + hl;

    SetNegateFlag(false);
    SetHalfCarryFlag(((hl & 0xFFF) + (hl & 0xFFF)) & 0x1000);
    SetCarryFlag((result & 0x10000) != 0);

    hl = static_cast<u16>(result);

    timer.AdvanceCycles(4);
}